

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermOut.cpp
# Opt level: O0

bool __thiscall
glslang::TOutputTraverser::visitLoop(TOutputTraverser *this,TVisit param_1,TIntermLoop *node)

{
  TInfoSink *infoSink;
  bool bVar1;
  int iVar2;
  TIntermTyped *pTVar3;
  TIntermNode *pTVar4;
  TInfoSink *out;
  TIntermLoop *node_local;
  TVisit param_1_local;
  TOutputTraverser *this_local;
  
  infoSink = this->infoSink;
  OutputTreeText(infoSink,&node->super_TIntermNode,(this->super_TIntermTraverser).depth);
  TInfoSinkBase::operator<<(&infoSink->debug,"Loop with condition ");
  bVar1 = TIntermLoop::testFirst(node);
  if (!bVar1) {
    TInfoSinkBase::operator<<(&infoSink->debug,"not ");
  }
  TInfoSinkBase::operator<<(&infoSink->debug,"tested first");
  bVar1 = TIntermLoop::getUnroll(node);
  if (bVar1) {
    TInfoSinkBase::operator<<(&infoSink->debug,": Unroll");
  }
  bVar1 = TIntermLoop::getDontUnroll(node);
  if (bVar1) {
    TInfoSinkBase::operator<<(&infoSink->debug,": DontUnroll");
  }
  iVar2 = TIntermLoop::getLoopDependency(node);
  if (iVar2 != 0) {
    TInfoSinkBase::operator<<(&infoSink->debug,": Dependency ");
    iVar2 = TIntermLoop::getLoopDependency(node);
    TInfoSinkBase::operator<<(&infoSink->debug,iVar2);
  }
  TInfoSinkBase::operator<<(&infoSink->debug,"\n");
  (this->super_TIntermTraverser).depth = (this->super_TIntermTraverser).depth + 1;
  OutputTreeText(this->infoSink,&node->super_TIntermNode,(this->super_TIntermTraverser).depth);
  pTVar3 = TIntermLoop::getTest(node);
  if (pTVar3 == (TIntermTyped *)0x0) {
    TInfoSinkBase::operator<<(&infoSink->debug,"No loop condition\n");
  }
  else {
    TInfoSinkBase::operator<<(&infoSink->debug,"Loop Condition\n");
    pTVar3 = TIntermLoop::getTest(node);
    (*(pTVar3->super_TIntermNode)._vptr_TIntermNode[2])(pTVar3,this);
  }
  OutputTreeText(this->infoSink,&node->super_TIntermNode,(this->super_TIntermTraverser).depth);
  pTVar4 = TIntermLoop::getBody(node);
  if (pTVar4 == (TIntermNode *)0x0) {
    TInfoSinkBase::operator<<(&infoSink->debug,"No loop body\n");
  }
  else {
    TInfoSinkBase::operator<<(&infoSink->debug,"Loop Body\n");
    pTVar4 = TIntermLoop::getBody(node);
    (*pTVar4->_vptr_TIntermNode[2])(pTVar4,this);
  }
  pTVar3 = TIntermLoop::getTerminal(node);
  if (pTVar3 != (TIntermTyped *)0x0) {
    OutputTreeText(this->infoSink,&node->super_TIntermNode,(this->super_TIntermTraverser).depth);
    TInfoSinkBase::operator<<(&infoSink->debug,"Loop Terminal Expression\n");
    pTVar3 = TIntermLoop::getTerminal(node);
    (*(pTVar3->super_TIntermNode)._vptr_TIntermNode[2])(pTVar3,this);
  }
  (this->super_TIntermTraverser).depth = (this->super_TIntermTraverser).depth + -1;
  return false;
}

Assistant:

bool TOutputTraverser::visitLoop(TVisit /* visit */, TIntermLoop* node)
{
    TInfoSink& out = infoSink;

    OutputTreeText(out, node, depth);

    out.debug << "Loop with condition ";
    if (! node->testFirst())
        out.debug << "not ";
    out.debug << "tested first";

    if (node->getUnroll())
        out.debug << ": Unroll";
    if (node->getDontUnroll())
        out.debug << ": DontUnroll";
    if (node->getLoopDependency()) {
        out.debug << ": Dependency ";
        out.debug << node->getLoopDependency();
    }
    out.debug << "\n";

    ++depth;

    OutputTreeText(infoSink, node, depth);
    if (node->getTest()) {
        out.debug << "Loop Condition\n";
        node->getTest()->traverse(this);
    } else
        out.debug << "No loop condition\n";

    OutputTreeText(infoSink, node, depth);
    if (node->getBody()) {
        out.debug << "Loop Body\n";
        node->getBody()->traverse(this);
    } else
        out.debug << "No loop body\n";

    if (node->getTerminal()) {
        OutputTreeText(infoSink, node, depth);
        out.debug << "Loop Terminal Expression\n";
        node->getTerminal()->traverse(this);
    }

    --depth;

    return false;
}